

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

BaseState<true> * __thiscall
BaseState<true>::Key(BaseState<true> *this,Context<true> *ctx,char *str,SizeType len,bool param_4)

{
  stringstream *psVar1;
  size_t sVar2;
  ostream *poVar3;
  
  psVar1 = Context<true>::error_abi_cxx11_(ctx);
  psVar1 = psVar1 + 0x10;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)psVar1,"Unexpected token: key(\'",0x17);
  if (str == (char *)0x0) {
    std::ios::clear((int)psVar1 + (int)*(undefined8 *)(*(long *)psVar1 + -0x18));
  }
  else {
    sVar2 = strlen(str);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,str,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar1,"\' len: ",7);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)psVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  return (BaseState<true> *)0x0;
}

Assistant:

virtual BaseState<audit>* Key(Context<audit>& ctx, const char* str, rapidjson::SizeType len, bool /* copy */)
  {
    ctx.error() << "Unexpected token: key('" << str << "' len: " << len << ")";
    return nullptr;
  }